

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O1

int __thiscall cmValue::Compare(cmValue *this,cmValue value)

{
  string *psVar1;
  int iVar2;
  
  psVar1 = this->Value;
  if (psVar1 == (string *)0x0) {
    iVar2 = -(uint)(psVar1 != (string *)0x0 || value.Value != (string *)0x0);
  }
  else if (value.Value == (string *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((string *)psVar1);
  }
  return iVar2;
}

Assistant:

int cmValue::Compare(cmValue value) const noexcept
{
  if (this->Value == nullptr && !value) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (!value) {
    return 1;
  }
  return this->Value->compare(*value);
}